

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFAcroFormDocumentHelper::transformAnnotations
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *old_annots,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_annots,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_fields,
          set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *old_fields,
          QPDFMatrix *cm,QPDF *from_qpdf,QPDFAcroFormDocumentHelper *from_afdh)

{
  _Rb_tree_node_base *this_00;
  QPDFObjectHandle *pQVar1;
  Rectangle r;
  pointer pQVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  QPDFObjGen QVar10;
  iterator iVar11;
  iterator iVar12;
  iterator iVar13;
  iterator iVar14;
  size_type sVar15;
  mapped_type *value;
  QPDFObjectHandle *pQVar16;
  QPDFAnnotationObjectHelper *key;
  QPDFAcroFormDocumentHelper *this_01;
  string *key_00;
  bool override_q;
  bool have_parent;
  QPDFAcroFormDocumentHelper *local_518;
  QPDFAnnotationObjectHelper ah;
  int local_4d4;
  QPDFObjectHandle *local_4d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  dr_map;
  QPDFObjGen parent_og;
  list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> queue;
  QPDFObjectHandle acroform;
  QPDFObjectHandle ffield_oh;
  QPDFObjectHandle dr;
  QPDFAcroFormDocumentHelper *local_438;
  Matrix m1;
  QPDFObjectHandle parent;
  QPDFObjectHandle from_dr;
  QPDFObjectHandle from_acroform;
  T annot;
  Rectangle rect;
  QPDFObjectHandle new_matrix;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [2];
  QPDFObjectHandle top_field;
  QPDFObjectHandle kids;
  map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  orig_to_copy;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> streams;
  string default_da;
  anon_class_16_2_6a8246dc maybe_copy_object;
  QPDFObjectHandle apdict;
  QPDFArrayItems local_268;
  shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
  QPDFObjGen local_220;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_218;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_208;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1f8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1e8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  QPDFAcroFormDocumentHelper local_1b8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_198;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_178;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_168;
  string from_default_da;
  iterator __begin1;
  set added_new_fields;
  iterator __end1;
  Rectangle local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  local_98;
  QPDFAnnotationObjectHelper local_68;
  
  afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pQVar16 = (QPDFObjectHandle *)(this->super_QPDFDocumentHelper).qpdf;
  local_4d0 = (QPDFObjectHandle *)from_qpdf;
  local_518 = this;
  pQVar1 = pQVar16;
  local_438 = this;
  if ((from_qpdf != (QPDF *)0x0) &&
     (local_438 = from_afdh, pQVar1 = local_4d0,
     from_afdh == (QPDFAcroFormDocumentHelper *)0x0 && pQVar16 != (QPDFObjectHandle *)from_qpdf)) {
    std::make_shared<QPDFAcroFormDocumentHelper,QPDF&>((QPDF *)&default_da);
    std::__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2> *)&default_da);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&default_da._M_string_length);
    local_438 = afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    pQVar16 = (QPDFObjectHandle *)(local_518->super_QPDFDocumentHelper).qpdf;
  }
  local_4d0 = pQVar1;
  QPDF::getRoot((QPDF *)&ah);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&default_da,"/AcroForm",(allocator<char> *)&dr_map);
  QPDFObjectHandle::getKey(&acroform,(string *)&ah);
  std::__cxx11::string::~string((string *)&default_da);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &ah.super_QPDFObjectHelper.super_BaseHandle);
  QPDF::getRoot((QPDF *)&ah);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&default_da,"/AcroForm",(allocator<char> *)&dr_map);
  QPDFObjectHandle::getKey(&from_acroform,(string *)&ah);
  std::__cxx11::string::~string((string *)&default_da);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &ah.super_QPDFObjectHelper.super_BaseHandle);
  from_default_da._M_dataplus._M_p = (pointer)&from_default_da.field_2;
  from_default_da._M_string_length = 0;
  from_default_da.field_2._M_local_buf[0] = '\0';
  QPDFObjectHandle::newNull();
  if (local_4d0 == pQVar16) {
    local_4d4 = 0;
    override_q = false;
    bVar3 = false;
  }
  else {
    default_da._M_dataplus._M_p = (pointer)&default_da.field_2;
    default_da._M_string_length = 0;
    default_da.field_2._M_local_buf[0] = '\0';
    bVar3 = QPDFObjectHandle::isDictionary(&acroform);
    iVar7 = 0;
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ah,"/DA",(allocator<char> *)&orig_to_copy);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&dr_map,(string *)&acroform);
      bVar3 = QPDFObjectHandle::isString((QPDFObjectHandle *)&dr_map);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &dr_map._M_t._M_impl.super__Rb_tree_header);
      std::__cxx11::string::~string((string *)&ah);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&dr_map,"/DA",(allocator<char> *)&added_new_fields);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&orig_to_copy,(string *)&acroform);
        QPDFObjectHandle::getUTF8Value_abi_cxx11_((string *)&ah,(QPDFObjectHandle *)&orig_to_copy);
        std::__cxx11::string::operator=((string *)&default_da,(string *)&ah);
        std::__cxx11::string::~string((string *)&ah);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &orig_to_copy._M_t._M_impl.super__Rb_tree_header);
        std::__cxx11::string::~string((string *)&dr_map);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ah,"/Q",(allocator<char> *)&orig_to_copy);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&dr_map,(string *)&acroform);
      bVar3 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&dr_map);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &dr_map._M_t._M_impl.super__Rb_tree_header);
      std::__cxx11::string::~string((string *)&ah);
      iVar7 = 0;
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ah,"/Q",(allocator<char> *)&orig_to_copy);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&dr_map,(string *)&acroform);
        iVar7 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)&dr_map);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &dr_map._M_t._M_impl.super__Rb_tree_header);
        std::__cxx11::string::~string((string *)&ah);
      }
    }
    bVar3 = QPDFObjectHandle::isDictionary(&from_acroform);
    local_4d4 = 0;
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ah,"/DR",(allocator<char> *)&orig_to_copy);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&dr_map,(string *)&from_acroform);
      bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&dr_map);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &dr_map._M_t._M_impl.super__Rb_tree_header);
      std::__cxx11::string::~string((string *)&ah);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ah,"/DR",(allocator<char> *)&orig_to_copy);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&dr_map,(string *)&from_acroform);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&from_dr,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dr_map);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &dr_map._M_t._M_impl.super__Rb_tree_header);
        std::__cxx11::string::~string((string *)&ah);
        bVar3 = QPDFObjectHandle::isIndirect(&from_dr);
        if (!bVar3) {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_168,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&from_dr);
          QPDF::makeIndirectObject((QPDF *)&ah,local_4d0);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&from_dr,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ah);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &ah.super_QPDFObjectHelper.super_BaseHandle);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
        }
        pQVar1 = (QPDFObjectHandle *)(local_518->super_QPDFDocumentHelper).qpdf;
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_178,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&from_dr);
        QPDF::copyForeignObject((QPDF *)&ah,pQVar1);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&from_dr,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ah);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &ah.super_QPDFObjectHelper.super_BaseHandle);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178._M_refcount);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ah,"/DA",(allocator<char> *)&orig_to_copy);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&dr_map,(string *)&from_acroform);
      bVar3 = QPDFObjectHandle::isString((QPDFObjectHandle *)&dr_map);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &dr_map._M_t._M_impl.super__Rb_tree_header);
      std::__cxx11::string::~string((string *)&ah);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&dr_map,"/DA",(allocator<char> *)&added_new_fields);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&orig_to_copy,(string *)&from_acroform);
        QPDFObjectHandle::getUTF8Value_abi_cxx11_((string *)&ah,(QPDFObjectHandle *)&orig_to_copy);
        std::__cxx11::string::operator=((string *)&from_default_da,(string *)&ah);
        std::__cxx11::string::~string((string *)&ah);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &orig_to_copy._M_t._M_impl.super__Rb_tree_header);
        std::__cxx11::string::~string((string *)&dr_map);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ah,"/Q",(allocator<char> *)&orig_to_copy);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&dr_map,(string *)&from_acroform);
      bVar3 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&dr_map);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &dr_map._M_t._M_impl.super__Rb_tree_header);
      std::__cxx11::string::~string((string *)&ah);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ah,"/Q",(allocator<char> *)&orig_to_copy);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&dr_map,(string *)&from_acroform);
        local_4d4 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)&dr_map);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &dr_map._M_t._M_impl.super__Rb_tree_header);
        std::__cxx11::string::~string((string *)&ah);
      }
    }
    bVar3 = std::operator!=(&from_default_da,&default_da);
    override_q = local_4d4 != iVar7;
    std::__cxx11::string::~string((string *)&default_da);
  }
  dr_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dr_map._M_t._M_impl.super__Rb_tree_header._M_header;
  dr_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dr_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dr_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dr_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dr_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDFObjectHandle::newNull();
  orig_to_copy._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orig_to_copy._M_t._M_impl.super__Rb_tree_header._M_header;
  orig_to_copy._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  orig_to_copy._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  orig_to_copy._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  maybe_copy_object.orig_to_copy = &orig_to_copy;
  maybe_copy_object.this = local_518;
  added_new_fields.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_left =
       &added_new_fields.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
        _M_t._M_impl.super__Rb_tree_header._M_header;
  added_new_fields.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  added_new_fields.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  added_new_fields.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
  _M_impl.super__Rb_tree_header._M_node_count = 0;
  orig_to_copy._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orig_to_copy._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  added_new_fields.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_right =
       added_new_fields.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
       _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDFObjectHandle::aitems(&local_268.oh);
  QPDFObjectHandle::QPDFArrayItems::begin(&__begin1,&local_268);
  QPDFObjectHandle::QPDFArrayItems::end(&__end1,&local_268);
  bVar6 = false;
  do {
    bVar4 = QPDFObjectHandle::QPDFArrayItems::iterator::operator!=(&__begin1,&__end1);
    if (!bVar4) {
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&__end1);
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&__begin1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_268.oh.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                   *)&added_new_fields);
      std::
      _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
      ::~_Rb_tree(&orig_to_copy._M_t);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dr.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::~_Rb_tree(&dr_map._M_t);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&from_dr.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&from_default_da);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&from_acroform.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&acroform.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return;
    }
    p_Var9 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             QPDFObjectHandle::QPDFArrayItems::iterator::operator*(&__begin1);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&annot,p_Var9);
    bVar4 = QPDFObjectHandle::isStream((QPDFObjectHandle *)&annot);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&default_da,"ignoring annotation that\'s a stream",(allocator<char> *)&ah
                );
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&annot,&default_da);
      std::__cxx11::string::~string((string *)&default_da);
    }
    else {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_188,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&annot);
      QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper
                (&local_68,(QPDFObjectHandle *)&local_188);
      getFieldForAnnotation((QPDFFormFieldObjectHelper *)&default_da,local_438,&local_68);
      QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_188._M_refcount);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ffield_oh,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &default_da._M_string_length);
      top_field.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      top_field.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      have_parent = false;
      bVar4 = QPDFObjectHandle::isStream(&ffield_oh);
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ah,"ignoring form field that\'s a stream",(allocator<char> *)&rect);
        QPDFObjectHandle::warnIfPossible(&ffield_oh,(string *)&ah);
LAB_00148c51:
        std::__cxx11::string::~string((string *)&ah);
LAB_00148c96:
        bVar4 = false;
      }
      else {
        bVar4 = QPDFObjectHandle::isNull(&ffield_oh);
        if ((!bVar4) && (bVar4 = QPDFObjectHandle::isIndirect(&ffield_oh), !bVar4)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ah,"ignoring form field not indirect",(allocator<char> *)&rect);
          QPDFObjectHandle::warnIfPossible(&ffield_oh,(string *)&ah);
          goto LAB_00148c51;
        }
        bVar4 = QPDFObjectHandle::isNull(&ffield_oh);
        if (bVar4) goto LAB_00148c96;
        QPDFFormFieldObjectHelper::getTopLevelField
                  ((QPDFFormFieldObjectHelper *)&ah,(QPDFFormFieldObjectHelper *)&default_da,
                   &have_parent);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&rect,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                   &ah.super_QPDFObjectHelper.super_BaseHandle);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&top_field,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&rect);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rect.lly);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)&ah);
        if (local_4d0 == pQVar16) {
          ah.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)QPDFObjectHandle::getObjGen(&top_field);
          std::
          _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
          ::_M_insert_unique<QPDFObjGen>(&old_fields->_M_t,(QPDFObjGen *)&ah);
        }
        else {
          pQVar1 = (QPDFObjectHandle *)(local_518->super_QPDFDocumentHelper).qpdf;
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_198,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&top_field);
          QPDF::copyForeignObject((QPDF *)&ah,pQVar1);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&top_field,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ah);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &ah.super_QPDFObjectHelper.super_BaseHandle);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198._M_refcount);
          pQVar1 = (QPDFObjectHandle *)(local_518->super_QPDFDocumentHelper).qpdf;
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_1b8.m,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ffield_oh);
          QPDF::copyForeignObject((QPDF *)&ah,pQVar1);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ffield_oh,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ah);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &ah.super_QPDFObjectHelper.super_BaseHandle);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_1b8.m.
                      super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        queue.super__List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl._M_node.
        super__List_node_base._M_next = (_List_node_base *)&queue;
        queue.super__List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl._M_node.
        _M_size = 0;
        rect.lly = (double)((ulong)rect.lly & 0xffffffff00000000);
        rect.urx = 0.0;
        rect.ury = (double)&rect.lly;
        queue.super__List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl._M_node.
        super__List_node_base._M_prev =
             queue.super__List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
             _M_node.super__List_node_base._M_next;
        bVar4 = transformAnnotations::anon_class_16_2_6a8246dc::operator()
                          (&maybe_copy_object,&top_field);
        if (bVar4) {
          std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    (&queue,&top_field);
        }
        while (queue.super__List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
               _M_node.super__List_node_base._M_next != (_List_node_base *)&queue) {
          key_00 = (string *)
                   (queue.super__List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                    _M_impl._M_node.super__List_node_base._M_next + 1);
          QVar10 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)key_00);
          bVar4 = QPDFObjGen::set::add((set *)&rect,QVar10);
          if (bVar4) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ah,"/Parent",(allocator<char> *)&m1);
            QPDFObjectHandle::getKey(&parent,key_00);
            std::__cxx11::string::~string((string *)&ah);
            bVar4 = QPDFObjectHandle::isIndirect(&parent);
            if (bVar4) {
              parent_og = QPDFObjectHandle::getObjGen(&parent);
              sVar15 = std::
                       map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                       ::count(&orig_to_copy,&parent_og);
              if (sVar15 == 0) {
                local_220 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)key_00);
                QPDFObjGen::unparse_abi_cxx11_((string *)&apdict,&local_220,',');
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &streams,"while traversing field ",(string *)&apdict);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &new_matrix,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &streams,", found parent (");
                QPDFObjGen::unparse_abi_cxx11_((string *)&kids,&parent_og,',');
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &m1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&new_matrix,(string *)&kids);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ah,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&m1,
                               ") that had not been seen, indicating likely invalid field structure"
                              );
                QPDFObjectHandle::warnIfPossible(&parent,(string *)&ah);
                std::__cxx11::string::~string((string *)&ah);
                std::__cxx11::string::~string((string *)&m1);
                std::__cxx11::string::~string((string *)&kids);
                std::__cxx11::string::~string((string *)&new_matrix);
                std::__cxx11::string::~string((string *)&streams);
                key = (QPDFAnnotationObjectHelper *)&apdict;
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&ah,"/Parent",(allocator<char> *)&m1);
                value = std::
                        map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                        ::operator[](&orig_to_copy,&parent_og);
                key = &ah;
                QPDFObjectHandle::replaceKey((QPDFObjectHandle *)key_00,(string *)key,value);
              }
              std::__cxx11::string::~string((string *)key);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ah,"/Kids",(allocator<char> *)&m1);
            QPDFObjectHandle::getKey(&kids,key_00);
            std::__cxx11::string::~string((string *)&ah);
            bVar4 = QPDFObjectHandle::isArray(&kids);
            if (bVar4) {
              for (iVar7 = 0; iVar8 = QPDFObjectHandle::getArrayNItems(&kids), iVar7 < iVar8;
                  iVar7 = iVar7 + 1) {
                QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&ah,(int)&kids);
                bVar4 = transformAnnotations::anon_class_16_2_6a8246dc::operator()
                                  (&maybe_copy_object,(QPDFObjectHandle *)&ah);
                if (bVar4) {
                  QPDFObjectHandle::setArrayItem(&kids,iVar7,(QPDFObjectHandle *)&ah);
                  std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                            (&queue,(value_type *)&ah);
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &ah.super_QPDFObjectHelper.super_BaseHandle);
              }
            }
            if (override_q != false || bVar3 != false) {
              this_01 = &local_1b8;
              std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_1b8,
                         (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key_00);
              adjustInheritedFields
                        (this_01,(QPDFObjectHandle *)&local_1b8,bVar3,&from_default_da,override_q,
                         local_4d4);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_1b8.super_QPDFDocumentHelper.qpdf);
            }
            if (local_4d0 != pQVar16) {
              if (!bVar6) {
                bVar6 = QPDFObjectHandle::isDictionary(&acroform);
                if (!bVar6) {
                  getOrCreateAcroForm((QPDFAcroFormDocumentHelper *)&ah);
                  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&acroform,
                             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ah);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &ah.super_QPDFObjectHelper.super_BaseHandle);
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&ah,"/DR",(allocator<char> *)&new_matrix);
                QPDFObjectHandle::getKey((QPDFObjectHandle *)&m1,(string *)&acroform);
                std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dr,
                           (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&m1);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
                std::__cxx11::string::~string((string *)&ah);
                bVar6 = QPDFObjectHandle::isDictionary(&dr);
                if (!bVar6) {
                  QPDFObjectHandle::newDictionary();
                  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dr,
                             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ah);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &ah.super_QPDFObjectHelper.super_BaseHandle);
                }
                QPDFObjectHandle::makeResourcesIndirect
                          (&dr,(local_518->super_QPDFDocumentHelper).qpdf);
                bVar6 = QPDFObjectHandle::isIndirect(&dr);
                if (!bVar6) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&ah,"/DR",(allocator<char> *)&parent_og);
                  pQVar1 = (QPDFObjectHandle *)(local_518->super_QPDFDocumentHelper).qpdf;
                  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&streams,
                             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dr);
                  QPDF::makeIndirectObject((QPDF *)&new_matrix,pQVar1);
                  QPDFObjectHandle::replaceKeyAndGetNew
                            ((QPDFObjectHandle *)&m1,(string *)&acroform,(QPDFObjectHandle *)&ah);
                  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dr,
                             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&m1);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&new_matrix.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &streams.
                              super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
                  std::__cxx11::string::~string((string *)&ah);
                }
                QPDFObjectHandle::makeResourcesIndirect
                          (&from_dr,(local_518->super_QPDFDocumentHelper).qpdf);
                std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&apdict,
                           (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&from_dr);
                QPDFObjectHandle::mergeResources(&dr,&apdict,&dr_map);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&apdict.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
                bVar6 = getNeedAppearances(local_438);
                if (bVar6) {
                  setNeedAppearances(local_518,true);
                }
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&ah,"/DR",(allocator<char> *)&m1);
              bVar6 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)key_00,(string *)&ah);
              std::__cxx11::string::~string((string *)&ah);
              if (bVar6) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&ah,"/DR",(allocator<char> *)&m1);
                QPDFObjectHandle::replaceKey((QPDFObjectHandle *)key_00,(string *)&ah,&dr);
                std::__cxx11::string::~string((string *)&ah);
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&ah,"/DA",(allocator<char> *)&new_matrix);
              QPDFObjectHandle::getKey((QPDFObjectHandle *)&m1,key_00);
              bVar4 = QPDFObjectHandle::isString((QPDFObjectHandle *)&m1);
              bVar5 = dr_map._M_t._M_impl.super__Rb_tree_header._M_node_count != 0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
              std::__cxx11::string::~string((string *)&ah);
              bVar6 = true;
              if (bVar4 && bVar5) {
                std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_1c8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key_00
                          );
                adjustDefaultAppearances(local_518,(QPDFObjectHandle *)&local_1c8,&dr_map);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_1c8._M_refcount);
              }
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&kids.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&parent.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          }
          std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::pop_front(&queue)
          ;
        }
        transformAnnotations::anon_class_16_2_6a8246dc::operator()(&maybe_copy_object,&ffield_oh);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1d8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ffield_oh);
        QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)&ah,(QPDFObjectHandle *)&local_1d8);
        QPDFFormFieldObjectHelper::operator=
                  ((QPDFFormFieldObjectHelper *)&default_da,(QPDFFormFieldObjectHelper *)&ah);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)&ah);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8._M_refcount);
        std::
        _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
        ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                     *)&rect);
        std::__cxx11::_List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_clear
                  (&queue.super__List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>);
        bVar4 = true;
      }
      if (local_4d0 != pQVar16) {
        bVar5 = QPDFObjectHandle::isIndirect(&annot);
        if (!bVar5) {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_1e8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&annot);
          QPDF::makeIndirectObject((QPDF *)&ah,local_4d0);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&annot,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ah);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &ah.super_QPDFObjectHelper.super_BaseHandle);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
        }
        pQVar1 = (QPDFObjectHandle *)(local_518->super_QPDFDocumentHelper).qpdf;
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1f8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&annot);
        QPDF::copyForeignObject((QPDF *)&ah,pQVar1);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&annot,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ah);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &ah.super_QPDFObjectHelper.super_BaseHandle);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
      }
      transformAnnotations::anon_class_16_2_6a8246dc::operator()(&maybe_copy_object,&annot);
      if (bVar4) {
        QVar10 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&top_field.super_BaseHandle);
        bVar4 = QPDFObjGen::set::add(&added_new_fields,QVar10);
        if (bVar4) {
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    (new_fields,&top_field);
        }
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back(new_annots,&annot)
      ;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_208,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&annot);
      QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper(&ah,(QPDFObjectHandle *)&local_208);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount);
      QPDFAnnotationObjectHelper::getAppearanceDictionary((QPDFAnnotationObjectHelper *)&apdict);
      streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&rect,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&apdict);
      iVar11 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&rect);
      iVar12 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&rect);
      for (; iVar11._M_node != iVar12._M_node;
          iVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar11._M_node)) {
        this_00 = iVar11._M_node + 2;
        bVar4 = QPDFObjectHandle::isStream((QPDFObjectHandle *)this_00);
        if (bVar4) {
          transformAnnotations(QPDFObjectHandle,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>&,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>&,std::set<QPDFObjGen,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>&,QPDFMatrix_const&,QPDF*,QPDFAcroFormDocumentHelper*)
          ::$_0::operator()((__0 *)&m1,&apdict,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (iVar11._M_node + 1),(QPDFObjectHandle *)this_00);
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
          emplace_back<QPDFObjectHandle>(&streams,(QPDFObjectHandle *)&m1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
        }
        else {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&m1,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this_00);
          iVar13 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&m1);
          iVar14 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&m1);
          for (; iVar13._M_node != iVar14._M_node;
              iVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar13._M_node)) {
            bVar4 = QPDFObjectHandle::isStream((QPDFObjectHandle *)(iVar13._M_node + 2));
            if (bVar4) {
              transformAnnotations(QPDFObjectHandle,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>&,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>&,std::set<QPDFObjGen,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>&,QPDFMatrix_const&,QPDF*,QPDFAcroFormDocumentHelper*)
              ::$_0::operator()((__0 *)&new_matrix,(QPDFObjectHandle *)this_00,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(iVar13._M_node + 1),(QPDFObjectHandle *)(iVar13._M_node + 2));
              std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
              emplace_back<QPDFObjectHandle>(&streams,&new_matrix);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&new_matrix.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rect.lly);
      pQVar2 = streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (p_Var9 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                    streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          p_Var9 != (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pQVar2;
          p_Var9 = p_Var9 + 1) {
        QPDFObjectHandle::getDict(&kids);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rect,"/Matrix",(allocator<char> *)&m1);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&queue,(string *)&kids);
        std::__cxx11::string::~string((string *)&rect);
        QPDFMatrix::QPDFMatrix((QPDFMatrix *)&rect);
        bVar4 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&queue);
        if (bVar4) {
          QPDFObjectHandle::getArrayAsMatrix(&m1,(QPDFObjectHandle *)&queue);
          QPDFMatrix::QPDFMatrix((QPDFMatrix *)&new_matrix,&m1);
          rect.urx = (double)local_378[0]._0_8_;
          rect.ury = (double)local_378[0]._8_8_;
          rect.llx = (double)new_matrix.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          rect.lly = (double)new_matrix.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi;
        }
        QPDFMatrix::concat((QPDFMatrix *)&rect,cm);
        QPDFObjectHandle::newFromMatrix((QPDFMatrix *)&new_matrix);
        bVar4 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&queue);
        if (bVar4) {
LAB_001490ae:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&m1,"/Matrix",(allocator<char> *)&parent);
          QPDFObjectHandle::replaceKey(&kids,(string *)&m1,&new_matrix);
          std::__cxx11::string::~string((string *)&m1);
        }
        else {
          QPDFMatrix::QPDFMatrix((QPDFMatrix *)&m1);
          bVar4 = QPDFMatrix::operator!=((QPDFMatrix *)&rect,(QPDFMatrix *)&m1);
          if (bVar4) goto LAB_001490ae;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&m1,"/Resources",(allocator<char> *)&parent_og);
        QPDFObjectHandle::getKey(&parent,(string *)&kids);
        std::__cxx11::string::~string((string *)&m1);
        if ((dr_map._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
           (bVar4 = QPDFObjectHandle::isDictionary(&parent), bVar4)) {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_218,p_Var9)
          ;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::_Rb_tree(&local_98,&dr_map._M_t);
          adjustAppearanceStream
                    (local_518,(QPDFObjectHandle *)&local_218,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)&local_98);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::~_Rb_tree(&local_98);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&parent.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&new_matrix.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &queue.super__List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                    _M_impl._M_node.super__List_node_base._M_prev);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&kids.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&m1,"/Rect",(allocator<char> *)&kids);
      QPDFObjectHandle::getKey(&new_matrix,(string *)&annot);
      QPDFObjectHandle::getArrayAsRectangle(&local_b8,&new_matrix);
      r.lly = local_b8.lly;
      r.llx = local_b8.llx;
      r.urx = local_b8.urx;
      r.ury = local_b8.ury;
      QPDFMatrix::transformRectangle(&rect,cm,r);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_matrix.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&m1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&m1,"/Rect",(allocator<char> *)&kids);
      QPDFObjectHandle::newFromRectangle((Rectangle *)&new_matrix);
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&annot,(string *)&m1,&new_matrix);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_matrix.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&m1);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&streams);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&apdict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&ah);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&top_field.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ffield_oh.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                ((QPDFFormFieldObjectHelper *)&default_da);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&annot.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::QPDFArrayItems::iterator::operator++(&__begin1);
  } while( true );
}

Assistant:

void
QPDFAcroFormDocumentHelper::transformAnnotations(
    QPDFObjectHandle old_annots,
    std::vector<QPDFObjectHandle>& new_annots,
    std::vector<QPDFObjectHandle>& new_fields,
    std::set<QPDFObjGen>& old_fields,
    QPDFMatrix const& cm,
    QPDF* from_qpdf,
    QPDFAcroFormDocumentHelper* from_afdh)
{
    std::shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
    if (!from_qpdf) {
        // Assume these are from the same QPDF.
        from_qpdf = &qpdf;
        from_afdh = this;
    } else if ((from_qpdf != &qpdf) && (!from_afdh)) {
        afdhph = std::make_shared<QPDFAcroFormDocumentHelper>(*from_qpdf);
        from_afdh = afdhph.get();
    }
    bool foreign = (from_qpdf != &qpdf);

    // It's possible that we will transform annotations that don't include any form fields. This
    // code takes care not to muck around with /AcroForm unless we have to.

    QPDFObjectHandle acroform = qpdf.getRoot().getKey("/AcroForm");
    QPDFObjectHandle from_acroform = from_qpdf->getRoot().getKey("/AcroForm");

    // /DA and /Q may be inherited from the document-level /AcroForm dictionary. If we are copying a
    // foreign stream and the stream is getting one of these values from its document's /AcroForm,
    // we will need to copy the value explicitly so that it doesn't start getting its default from
    // the destination document.
    bool override_da = false;
    bool override_q = false;
    std::string from_default_da;
    int from_default_q = 0;
    // If we copy any form fields, we will need to merge the source document's /DR into this
    // document's /DR.
    QPDFObjectHandle from_dr = QPDFObjectHandle::newNull();
    if (foreign) {
        std::string default_da;
        int default_q = 0;
        if (acroform.isDictionary()) {
            if (acroform.getKey("/DA").isString()) {
                default_da = acroform.getKey("/DA").getUTF8Value();
            }
            if (acroform.getKey("/Q").isInteger()) {
                default_q = acroform.getKey("/Q").getIntValueAsInt();
            }
        }
        if (from_acroform.isDictionary()) {
            if (from_acroform.getKey("/DR").isDictionary()) {
                from_dr = from_acroform.getKey("/DR");
                if (!from_dr.isIndirect()) {
                    from_dr = from_qpdf->makeIndirectObject(from_dr);
                }
                from_dr = qpdf.copyForeignObject(from_dr);
            }
            if (from_acroform.getKey("/DA").isString()) {
                from_default_da = from_acroform.getKey("/DA").getUTF8Value();
            }
            if (from_acroform.getKey("/Q").isInteger()) {
                from_default_q = from_acroform.getKey("/Q").getIntValueAsInt();
            }
        }
        if (from_default_da != default_da) {
            override_da = true;
        }
        if (from_default_q != default_q) {
            override_q = true;
        }
    }

    // If we have to merge /DR, we will need a mapping of conflicting keys for rewriting /DA. Set
    // this up for lazy initialization in case we encounter any form fields.
    std::map<std::string, std::map<std::string, std::string>> dr_map;
    bool initialized_dr_map = false;
    QPDFObjectHandle dr = QPDFObjectHandle::newNull();
    auto init_dr_map = [&]() {
        if (!initialized_dr_map) {
            initialized_dr_map = true;
            // Ensure that we have a /DR that is an indirect
            // dictionary object.
            if (!acroform.isDictionary()) {
                acroform = getOrCreateAcroForm();
            }
            dr = acroform.getKey("/DR");
            if (!dr.isDictionary()) {
                dr = QPDFObjectHandle::newDictionary();
            }
            dr.makeResourcesIndirect(qpdf);
            if (!dr.isIndirect()) {
                dr = acroform.replaceKeyAndGetNew("/DR", qpdf.makeIndirectObject(dr));
            }
            // Merge the other document's /DR, creating a conflict map. mergeResources checks to
            // make sure both objects are dictionaries. By this point, if this is foreign, from_dr
            // has been copied, so we use the target qpdf as the owning qpdf.
            from_dr.makeResourcesIndirect(qpdf);
            dr.mergeResources(from_dr, &dr_map);

            if (from_afdh->getNeedAppearances()) {
                setNeedAppearances(true);
            }
        }
    };

    // This helper prevents us from copying the same object multiple times.
    std::map<QPDFObjGen, QPDFObjectHandle> orig_to_copy;
    auto maybe_copy_object = [&](QPDFObjectHandle& to_copy) {
        auto og = to_copy.getObjGen();
        if (orig_to_copy.count(og)) {
            to_copy = orig_to_copy[og];
            return false;
        } else {
            to_copy = qpdf.makeIndirectObject(to_copy.shallowCopy());
            orig_to_copy[og] = to_copy;
            return true;
        }
    };

    // Now do the actual copies.

    QPDFObjGen::set added_new_fields;
    for (auto annot: old_annots.aitems()) {
        if (annot.isStream()) {
            annot.warnIfPossible("ignoring annotation that's a stream");
            continue;
        }

        // Make copies of annotations and fields down to the appearance streams, preserving all
        // internal referential integrity. When the incoming annotations are from a different file,
        // we first copy them locally. Then, whether local or foreign, we copy them again so that if
        // we bring the same annotation in multiple times (e.g. overlaying a foreign page onto
        // multiple local pages or a local page onto multiple other local pages), we don't create
        // annotations that are referenced in more than one place. If we did that, the effect of
        // applying transformations would be cumulative, which is definitely not what we want.
        // Besides, annotations and fields are not intended to be referenced in multiple places.

        // Determine if this annotation is attached to a form field. If so, the annotation may be
        // the same object as the form field, or the form field may have the annotation as a kid. In
        // either case, we have to walk up the field structure to find the top-level field. Within
        // one iteration through a set of annotations, we don't want to copy the same item more than
        // once. For example, suppose we have field A with kids B, C, and D, each of which has
        // annotations BA, CA, and DA. When we get to BA, we will find that BA is a kid of B which
        // is under A. When we do a copyForeignObject of A, it will also copy everything else
        // because of the indirect references. When we clone BA, we will want to clone A and then
        // update A's clone's kid to point B's clone and B's clone's parent to point to A's clone.
        // The same thing holds for annotations. Next, when we get to CA, we will again discover
        // that A is the top, but we don't want to re-copy A. We want CA's clone to be linked to the
        // same clone as BA's. Failure to do this will break up things like radio button groups,
        // which all have to kids of the same parent.

        auto ffield = from_afdh->getFieldForAnnotation(annot);
        auto ffield_oh = ffield.getObjectHandle();
        QPDFObjectHandle top_field;
        bool have_field = false;
        bool have_parent = false;
        if (ffield_oh.isStream()) {
            ffield_oh.warnIfPossible("ignoring form field that's a stream");
        } else if ((!ffield_oh.isNull()) && (!ffield_oh.isIndirect())) {
            ffield_oh.warnIfPossible("ignoring form field not indirect");
        } else if (!ffield_oh.isNull()) {
            // A field and its associated annotation can be the same object. This matters because we
            // don't want to clone the annotation and field separately in this case.
            have_field = true;
            // Find the top-level field. It may be the field itself.
            top_field = ffield.getTopLevelField(&have_parent).getObjectHandle();
            if (foreign) {
                // copyForeignObject returns the same value if called multiple times with the same
                // field. Create/retrieve the local copy of the original field. This pulls over
                // everything the field references including annotations and appearance streams, but
                // it's harmless to call copyForeignObject on them too. They will already be copied,
                // so we'll get the right object back.

                // top_field and ffield_oh are known to be indirect.
                top_field = qpdf.copyForeignObject(top_field);
                ffield_oh = qpdf.copyForeignObject(ffield_oh);
            } else {
                // We don't need to add top_field to old_fields if it's foreign because the new copy
                // of the foreign field won't be referenced anywhere. It's just the starting point
                // for us to make an additional local copy of.
                old_fields.insert(top_field.getObjGen());
            }

            // Traverse the field, copying kids, and preserving integrity.
            std::list<QPDFObjectHandle> queue;
            QPDFObjGen::set seen;
            if (maybe_copy_object(top_field)) {
                queue.push_back(top_field);
            }
            for (; !queue.empty(); queue.pop_front()) {
                auto& obj = queue.front();
                if (seen.add(obj)) {
                    auto parent = obj.getKey("/Parent");
                    if (parent.isIndirect()) {
                        auto parent_og = parent.getObjGen();
                        if (orig_to_copy.count(parent_og)) {
                            obj.replaceKey("/Parent", orig_to_copy[parent_og]);
                        } else {
                            parent.warnIfPossible(
                                "while traversing field " + obj.getObjGen().unparse(',') +
                                ", found parent (" + parent_og.unparse(',') +
                                ") that had not been seen, indicating likely invalid field "
                                "structure");
                        }
                    }
                    auto kids = obj.getKey("/Kids");
                    if (kids.isArray()) {
                        for (int i = 0; i < kids.getArrayNItems(); ++i) {
                            auto kid = kids.getArrayItem(i);
                            if (maybe_copy_object(kid)) {
                                kids.setArrayItem(i, kid);
                                queue.push_back(kid);
                            }
                        }
                    }

                    if (override_da || override_q) {
                        adjustInheritedFields(
                            obj, override_da, from_default_da, override_q, from_default_q);
                    }
                    if (foreign) {
                        // Lazily initialize our /DR and the conflict map.
                        init_dr_map();
                        // The spec doesn't say anything about /DR on the field, but lots of writers
                        // put one there, and it is frequently the same as the document-level /DR.
                        // To avoid having the field's /DR point to information that we are not
                        // maintaining, just reset it to that if it exists. Empirical evidence
                        // suggests that many readers, including Acrobat, Adobe Acrobat Reader,
                        // chrome, firefox, the mac Preview application, and several of the free
                        // readers on Linux all ignore /DR at the field level.
                        if (obj.hasKey("/DR")) {
                            obj.replaceKey("/DR", dr);
                        }
                    }
                    if (foreign && obj.getKey("/DA").isString() && (!dr_map.empty())) {
                        adjustDefaultAppearances(obj, dr_map);
                    }
                }
            }

            // Now switch to copies. We already switched for top_field
            maybe_copy_object(ffield_oh);
            ffield = QPDFFormFieldObjectHelper(ffield_oh);
        }

        QTC::TC(
            "qpdf",
            "QPDFAcroFormDocumentHelper copy annotation",
            (have_field ? 1 : 0) | (foreign ? 2 : 0));
        if (have_field) {
            QTC::TC(
                "qpdf",
                "QPDFAcroFormDocumentHelper field with parent",
                (have_parent ? 1 : 0) | (foreign ? 2 : 0));
        }
        if (foreign) {
            if (!annot.isIndirect()) {
                annot = from_qpdf->makeIndirectObject(annot);
            }
            annot = qpdf.copyForeignObject(annot);
        }
        maybe_copy_object(annot);

        // Now we have copies, so we can safely mutate.
        if (have_field && added_new_fields.add(top_field)) {
            new_fields.push_back(top_field);
        }
        new_annots.push_back(annot);

        // Identify and copy any appearance streams

        auto ah = QPDFAnnotationObjectHelper(annot);
        auto apdict = ah.getAppearanceDictionary();
        std::vector<QPDFObjectHandle> streams;
        auto replace_stream = [](auto& dict, auto& key, auto& old) {
            return dict.replaceKeyAndGetNew(key, old.copyStream());
        };

        for (auto& [key1, value1]: apdict.as_dictionary()) {
            if (value1.isStream()) {
                streams.emplace_back(replace_stream(apdict, key1, value1));
            } else {
                for (auto& [key2, value2]: value1.as_dictionary()) {
                    if (value2.isStream()) {
                        streams.emplace_back(replace_stream(value1, key2, value2));
                    }
                }
            }
        }

        // Now we can safely mutate the annotation and its appearance streams.
        for (auto& stream: streams) {
            auto dict = stream.getDict();
            auto omatrix = dict.getKey("/Matrix");
            QPDFMatrix apcm;
            if (omatrix.isArray()) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper modify ap matrix");
                auto m1 = omatrix.getArrayAsMatrix();
                apcm = QPDFMatrix(m1);
            }
            apcm.concat(cm);
            auto new_matrix = QPDFObjectHandle::newFromMatrix(apcm);
            if (omatrix.isArray() || (apcm != QPDFMatrix())) {
                dict.replaceKey("/Matrix", new_matrix);
            }
            auto resources = dict.getKey("/Resources");
            if ((!dr_map.empty()) && resources.isDictionary()) {
                adjustAppearanceStream(stream, dr_map);
            }
        }
        auto rect = cm.transformRectangle(annot.getKey("/Rect").getArrayAsRectangle());
        annot.replaceKey("/Rect", QPDFObjectHandle::newFromRectangle(rect));
    }
}